

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall
bsplib::Rdma::hpget(Rdma *this,int src_pid,Memslot src_slot,size_t src_offset,void *dst,size_t size)

{
  Memblock *pMVar1;
  size_type sVar2;
  ssize_t sVar3;
  int __flags;
  undefined1 local_b0 [8];
  Action action;
  int tag;
  Memslot dst_slot;
  undefined1 local_58 [8];
  TicToc t;
  size_t size_local;
  void *dst_local;
  size_t src_offset_local;
  Memslot src_slot_local;
  Rdma *pRStack_10;
  int src_pid_local;
  Rdma *this_local;
  
  t.m_nbytes = size;
  size_local = (size_t)dst;
  dst_local = (void *)src_offset;
  src_offset_local = src_slot;
  src_slot_local._4_4_ = src_pid;
  pRStack_10 = this;
  TicToc::TicToc((TicToc *)local_58,HPGET,0);
  __flags = (int)dst;
  if (t.m_nbytes < this->m_min_n_hp_msg_size) {
    get(this,src_slot_local._4_4_,src_offset_local,(size_t)dst_local,(void *)size_local,t.m_nbytes);
  }
  else {
    pMVar1 = slot(this,this->m_pid,src_offset_local);
    if ((pMVar1->status & 1) != 0) {
      __assert_fail("!( slot( m_pid, src_slot ).status & Memblock::PUSHED)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                    ,0x8f,"void bsplib::Rdma::hpget(int, Memslot, size_t, void *, size_t)");
    }
    sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_local_slots);
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (&this->m_local_slots,(value_type *)&size_local);
    sVar3 = Unbuf::recv(&this->m_unbuf,src_slot_local._4_4_,(void *)size_local,t.m_nbytes,__flags);
    action.src_pid = (int)sVar3;
    local_b0._0_4_ = HPGET;
    local_b0._4_4_ = src_slot_local._4_4_;
    action.kind = src_slot_local._4_4_;
    action.target_pid = this->m_pid;
    action._16_8_ = src_offset_local;
    action.dst_slot = (Memslot)dst_local;
    action.offset = t.m_nbytes;
    action.src_slot = sVar2;
    action.size._4_4_ = action.src_pid;
    ActionBuf::push_back(&this->m_send_actions,(Action *)local_b0);
  }
  TicToc::~TicToc((TicToc *)local_58);
  return;
}

Assistant:

void Rdma::hpget( int src_pid, Memslot src_slot, size_t src_offset,
        void * dst, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPGET );
#endif
    if ( size < m_min_n_hp_msg_size ) { 
        get( src_pid, src_slot, src_offset, dst, size );
        return;
    }

    assert( !( slot( m_pid, src_slot ).status & Memblock::PUSHED) );
    
    Memslot dst_slot = m_local_slots.size();
    m_local_slots.push_back( dst );

    int tag = m_unbuf.recv( src_pid, dst, size );
    Action action = { Action::HPGET, src_pid, src_pid, m_pid, 
                      tag, src_slot, dst_slot, src_offset, size };
    m_send_actions.push_back( action );

}